

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_copy_and_apply_volume_factor_per_channel_f32
               (float *pFramesOut,float *pFramesIn,ma_uint64 frameCount,ma_uint32 channels,
               float *pChannelGains)

{
  ulong uVar1;
  ma_uint64 mVar2;
  ulong uVar3;
  
  if (frameCount != 0) {
    uVar1 = (ulong)channels;
    mVar2 = 0;
    do {
      if (channels != 0) {
        uVar3 = 0;
        do {
          pFramesOut[uVar3] = pFramesIn[uVar3] * pChannelGains[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
      mVar2 = mVar2 + 1;
      pFramesOut = pFramesOut + uVar1;
      pFramesIn = pFramesIn + uVar1;
    } while (mVar2 != frameCount);
  }
  return;
}

Assistant:

MA_API void ma_copy_and_apply_volume_factor_per_channel_f32(float* pFramesOut, const float* pFramesIn, ma_uint64 frameCount, ma_uint32 channels, float* pChannelGains)
{
    ma_uint64 iFrame;

    if (channels == 2) {
        /* TODO: Do an optimized implementation for stereo and mono. Can do a SIMD optimized implementation as well. */
    }

    for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
        ma_uint32 iChannel;
        for (iChannel = 0; iChannel < channels; iChannel += 1) {
            pFramesOut[iFrame * channels + iChannel] = pFramesIn[iFrame * channels + iChannel] * pChannelGains[iChannel];
        }
    }
}